

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O3

vec4 dja::normalize(vec4 *a)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  vec4 vVar6;
  
  fVar1 = a->x;
  fVar2 = a->y;
  fVar3 = a->z;
  fVar4 = a->w;
  fVar5 = 1.0 / SQRT(fVar4 * fVar4 + fVar3 * fVar3 + fVar1 * fVar1 + fVar2 * fVar2);
  vVar6.x = fVar5 * fVar1;
  vVar6.y = fVar5 * fVar2;
  vVar6.w = fVar5 * fVar4;
  vVar6.z = fVar5 * fVar3;
  return vVar6;
}

Assistant:

V4 normalize(const V4& a) {return a / norm(a);}